

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

double __thiscall
ProbabEstimator::getProbabGt
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  int in_EDX;
  int in_ESI;
  ProbabEstimator *in_RDI;
  double in_XMM0_Qa;
  double base;
  double dVar1;
  double dVar2;
  double dVar3;
  int i;
  double val;
  double cPAr;
  double PAr;
  int local_34;
  double local_30;
  
  base = DistribFunction::getDistrib(in_RDI->distribFunction,in_XMM0_Qa);
  local_30 = 1.0;
  for (local_34 = 0; local_34 <= in_ESI; local_34 = local_34 + 1) {
    dVar1 = combNumber(in_RDI,in_EDX,local_34);
    dVar2 = pown(in_RDI,1.0 - base,local_34);
    dVar3 = pown(in_RDI,base,in_EDX - local_34);
    local_30 = local_30 - dVar1 * dVar2 * dVar3;
  }
  return local_30;
}

Assistant:

double ProbabEstimator::getProbabGt( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib(minValInRetained);
    double cPAr = 1.0-PAr;

    double val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ){
        val -= (double)combNumber( pathLength, i )*pown( cPAr, i )*pown(PAr, (pathLength-i));
    }

    return val;
}